

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronVErr(xmlSchematronValidCtxtPtr ctxt,int error,char *msg,xmlChar *str1)

{
  int iVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  void *pvStack_50;
  int res;
  void *data;
  xmlStructuredErrorFunc schannel;
  xmlGenericErrorFunc channel;
  xmlChar *str1_local;
  char *msg_local;
  int error_local;
  xmlSchematronValidCtxtPtr ctxt_local;
  
  schannel = (xmlStructuredErrorFunc)0x0;
  data = (void *)0x0;
  pvStack_50 = (void *)0x0;
  if (ctxt != (xmlSchematronValidCtxtPtr)0x0) {
    ctxt->nberrors = ctxt->nberrors + 1;
    schannel = (xmlStructuredErrorFunc)ctxt->error;
    pvStack_50 = ctxt->userData;
    data = ctxt->serror;
  }
  if ((schannel == (xmlStructuredErrorFunc)0x0) && (data == (void *)0x0)) {
    pp_Var2 = __xmlGenericError();
    schannel = (xmlStructuredErrorFunc)*pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    pvStack_50 = *ppvVar3;
  }
  iVar1 = xmlRaiseError((xmlStructuredErrorFunc)data,(xmlGenericErrorFunc)schannel,pvStack_50,ctxt,
                        (xmlNode *)0x0,0x11,error,XML_ERR_ERROR,(char *)0x0,0,(char *)str1,
                        (char *)0x0,(char *)0x0,0,0,msg,str1);
  if (iVar1 < 0) {
    xmlSchematronVErrMemory(ctxt);
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlSchematronVErr(xmlSchematronValidCtxtPtr ctxt, int error,
                  const char *msg, const xmlChar * str1)
{
    xmlGenericErrorFunc channel = NULL;
    xmlStructuredErrorFunc schannel = NULL;
    void *data = NULL;
    int res;

    if (ctxt != NULL) {
        ctxt->nberrors++;
        channel = ctxt->error;
        data = ctxt->userData;
        schannel = ctxt->serror;
    }